

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scantoken.cpp
# Opt level: O2

void __thiscall YAML::Scanner::ScanQuotedScalar(Scanner *this)

{
  int iVar1;
  pointer pRVar2;
  char ch;
  RegEx *ex;
  ScanScalarParams *params;
  undefined1 uVar3;
  undefined1 local_110 [48];
  RegEx end;
  _Alloc_hider local_c0;
  undefined1 local_b8 [16];
  string local_a8 [8];
  size_t local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  pointer local_88;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  undefined4 uStack_78;
  undefined8 uStack_74;
  RegEx local_68;
  string scalar;
  
  scalar._M_dataplus._M_p = (pointer)&scalar.field_2;
  scalar._M_string_length = 0;
  scalar.field_2._M_local_buf[0] = '\0';
  ch = YAML::Stream::peek(&this->INPUT);
  local_110._16_2_ = 0;
  local_110._36_4_ = 0;
  params = (ScanScalarParams *)0x0;
  local_110[0x12] = 0;
  local_110[0x28] = 0;
  if (ch == '\'') {
    RegEx::RegEx((RegEx *)&local_c0,'\'');
    ex = Exp::EscSingleQuote();
    operator!(&local_68,ex);
    operator&(&end,(RegEx *)&local_c0,&local_68);
    std::vector<YAML::RegEx,_std::allocator<YAML::RegEx>_>::~vector(&local_68.m_params);
    std::vector<YAML::RegEx,_std::allocator<YAML::RegEx>_>::~vector
              ((vector<YAML::RegEx,_std::allocator<YAML::RegEx>_> *)local_b8);
    uVar3 = 0x27;
  }
  else {
    uVar3 = 0x5c;
    RegEx::RegEx(&end,ch);
  }
  local_110._0_8_ = &end;
  local_110[8] = 1;
  local_110._12_4_ = 0;
  local_110._20_4_ = utf16be;
  local_110[0x11] = 1;
  local_110[0x18] = 0;
  local_110._28_8_ = 0x200000000;
  local_110[0x12] = uVar3;
  InsertPotentialSimpleKey(this);
  pRVar2 = *(pointer *)&(this->INPUT).m_mark;
  iVar1 = (this->INPUT).m_mark.column;
  YAML::Stream::get(&this->INPUT);
  ScanScalar_abi_cxx11_((string *)&local_c0,(YAML *)this,(Stream *)local_110,params);
  std::__cxx11::string::operator=((string *)&scalar,(string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  this->m_simpleKeyAllowed = false;
  this->m_canBeJSONFlow = true;
  local_c0._M_p = (pointer)0x1400000000;
  local_a8 = (string  [8])&local_98;
  local_a0 = 0;
  local_98._M_local_buf[0] = '\0';
  local_88 = (pointer)0x0;
  uStack_80 = 0;
  uStack_7c = 0;
  uStack_78 = 0;
  uStack_74 = 0;
  local_b8._0_8_ = pRVar2;
  local_b8._8_4_ = iVar1;
  std::__cxx11::string::_M_assign(local_a8);
  std::deque<YAML::Token,_std::allocator<YAML::Token>_>::push_back
            (&(this->m_tokens).c,(value_type *)&local_c0);
  Token::~Token((Token *)&local_c0);
  std::vector<YAML::RegEx,_std::allocator<YAML::RegEx>_>::~vector(&end.m_params);
  std::__cxx11::string::~string((string *)&scalar);
  return;
}

Assistant:

void Scanner::ScanQuotedScalar() {
  std::string scalar;

  // peek at single or double quote (don't eat because we need to preserve (for
  // the time being) the input position)
  char quote = INPUT.peek();
  bool single = (quote == '\'');

  // setup the scanning parameters
  ScanScalarParams params;
  RegEx end = (single ? RegEx(quote) & !Exp::EscSingleQuote() : RegEx(quote));
  params.end = &end;
  params.eatEnd = true;
  params.escape = (single ? '\'' : '\\');
  params.indent = 0;
  params.fold = FOLD_FLOW;
  params.eatLeadingWhitespace = true;
  params.trimTrailingSpaces = false;
  params.chomp = CLIP;
  params.onDocIndicator = THROW;

  // insert a potential simple key
  InsertPotentialSimpleKey();

  Mark mark = INPUT.mark();

  // now eat that opening quote
  INPUT.get();

  // and scan
  scalar = ScanScalar(INPUT, params);
  m_simpleKeyAllowed = false;
  m_canBeJSONFlow = true;

  Token token(Token::NON_PLAIN_SCALAR, mark);
  token.value = scalar;
  m_tokens.push(token);
}